

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_avx512_masked_ops(uint16_t *data,uint32_t len,uint32_t *flags)

{
  ushort *puVar1;
  uint32_t in_EAX;
  ulong uVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  
  if (len == 0) {
    auVar3 = ZEXT1664((undefined1  [16])0x0);
    len = in_EAX;
  }
  else {
    auVar3 = ZEXT1664((undefined1  [16])0x0);
    uVar2 = 0;
    do {
      puVar1 = data + uVar2;
      uVar2 = uVar2 + 1;
      auVar4 = vpmovm2d_avx512dq((ulong)*puVar1);
      auVar3 = vpsubd_avx512f(auVar3,auVar4);
    } while (len != uVar2);
  }
  auVar3 = vmovdqu64_avx512f(auVar3);
  *(undefined1 (*) [64])flags = auVar3;
  return len;
}

Assistant:

int pospopcnt_u16_avx512_masked_ops(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m512i counter = _mm512_setzero_si512();
    __m512i ones = _mm512_set1_epi32(1);

    for (int i = 0; i < len; ++i) {
        counter = _mm512_mask_add_epi32(counter, data[i], counter, ones);
    }

    _mm512_storeu_si512((__m512i*)flags, counter);
}